

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

_Bool export_ssh2(Filename *filename,int type,ssh2_userkey *key,char *passphrase)

{
  char *passphrase_local;
  ssh2_userkey *key_local;
  int type_local;
  Filename *filename_local;
  
  if (type == 4) {
    filename_local._7_1_ = openssh_auto_write(filename,key,passphrase);
  }
  else if (type == 6) {
    filename_local._7_1_ = openssh_new_write(filename,key,passphrase);
  }
  else if (type == 7) {
    filename_local._7_1_ = sshcom_write(filename,key,passphrase);
  }
  else {
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool export_ssh2(const Filename *filename, int type,
                 ssh2_userkey *key, char *passphrase)
{
    if (type == SSH_KEYTYPE_OPENSSH_AUTO)
        return openssh_auto_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_OPENSSH_NEW)
        return openssh_new_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_SSHCOM)
        return sshcom_write(filename, key, passphrase);
    return false;
}